

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseAssembler::embedConstPool(BaseAssembler *this,Label *label,ConstPool *pool)

{
  Section *pSVar1;
  ulong uVar2;
  Logger *pLVar3;
  long lVar4;
  bool bVar5;
  Error EVar6;
  Error extraout_EAX;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  uint8_t *dst;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [528];
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar6 = 5;
  }
  else {
    bVar5 = BaseEmitter::isLabelValid
                      (&this->super_BaseEmitter,(label->super_Operand).super_Operand_._baseId);
    if (bVar5) {
      EVar6 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[9])
                        (this,1,(ulong)(uint)pool->_alignment);
      if ((EVar6 == 0) &&
         (EVar6 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[6])(this,label), EVar6 == 0)) {
        uVar9 = pool->_size;
        EVar6 = 0;
        if (uVar9 != 0) {
          dst = this->_bufferPtr;
          if ((ulong)((long)this->_bufferEnd - (long)dst) < uVar9) {
            EVar6 = CodeHolder::growBuffer
                              ((this->super_BaseEmitter)._code,&this->_section->_buffer,uVar9);
            if (EVar6 != 0) goto LAB_0011585a;
            dst = this->_bufferPtr;
          }
          do {
            ConstPool::fill(pool,dst);
            pSVar1 = this->_section;
            uVar8 = (long)(dst + uVar9) - (long)this->_bufferData;
            if (uVar8 <= (pSVar1->_buffer)._capacity) {
              this->_bufferPtr = dst + uVar9;
              uVar2 = (pSVar1->_buffer)._size;
              if (uVar8 < uVar2) {
                uVar8 = uVar2;
              }
              (pSVar1->_buffer)._size = uVar8;
              pLVar3 = (this->super_BaseEmitter)._logger;
              if (pLVar3 == (Logger *)0x0) {
                return 0;
              }
              lVar4 = 0;
              if (pool->_minItemSize != 0) {
                for (; (pool->_minItemSize >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              bVar7 = 3;
              if ((uint)lVar4 < 3) {
                bVar7 = (byte)lVar4;
              }
              local_240 = local_238;
              uStack_250 = 0;
              local_258 = 0x20;
              local_248 = 0x207;
              local_238[0] = 0;
              Formatter::formatData
                        ((String *)&local_258,(pLVar3->_options)._flags,
                         (this->super_BaseEmitter)._environment._arch,
                         dataTypeIdBySize[1L << (bVar7 & 0x3f)],dst,uVar9 >> (bVar7 & 0x3f),1);
              String::_opChar((String *)&local_258,kAppend,'\n');
              pLVar3 = (this->super_BaseEmitter)._logger;
              uVar9 = uStack_250;
              puVar10 = local_240;
              if ((local_258 & 0xff) < 0x1f) {
                uVar9 = local_258 & 0xff;
                puVar10 = (undefined1 *)((long)&local_258 + 1);
              }
              (*pLVar3->_vptr_Logger[2])(pLVar3,puVar10,uVar9);
              String::reset((String *)&local_258);
              return 0;
            }
            embedConstPool();
            EVar6 = extraout_EAX;
LAB_0011585a:
            EVar6 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar6,(char *)0x0);
          } while (EVar6 == 0);
        }
      }
      return EVar6;
    }
    EVar6 = 0xc;
  }
  EVar6 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar6,(char *)0x0);
  return EVar6;
}

Assistant:

Error BaseAssembler::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(!isLabelValid(label)))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  size_t size = pool.size();
  if (!size)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, size));

#ifndef ASMJIT_NO_LOGGING
  uint8_t* data = writer.cursor();
#endif

  pool.fill(writer.cursor());
  writer.advance(size);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    uint32_t dataSizeLog2 = Support::min<uint32_t>(Support::ctz(pool.minItemSize()), 3);
    uint32_t dataSize = 1 << dataSizeLog2;

    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), dataTypeIdBySize[dataSize], data, size >> dataSizeLog2);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}